

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::AsyncStreamFd::writeInternal
          (AsyncStreamFd *this,ArrayPtr<const_unsigned_char> firstPiece,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces,ArrayPtr<const_int> fds)

{
  PromiseNode *pPVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  OwnPromiseNode node;
  int iVar5;
  iovec *__iovec;
  TransformPromiseNodeBase *pTVar6;
  ArrayPtr<const_unsigned_char> *pAVar7;
  undefined4 extraout_var;
  ArrayPtr<const_unsigned_char> *extraout_RAX;
  PromiseBase PVar8;
  undefined4 extraout_var_00;
  void *pvVar9;
  PromiseNode *extraout_RAX_00;
  OwnPromiseNode extraout_RAX_01;
  long lVar10;
  PromiseArena *pPVar11;
  PromiseNode *elementCount;
  ArrayPtr<const_int> *pAVar12;
  OwnPromiseNode *__dest;
  Disposer *in_R9;
  byte *pbVar13;
  byte *pbVar14;
  ArrayPtr<const_unsigned_char> *pAVar15;
  ulong elementCount_00;
  TransformPromiseNodeBase *pTVar16;
  ulong uVar17;
  bool bVar18;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces_00;
  ArrayPtr<const_unsigned_char> firstPiece_00;
  Array<iovec> iov_heap;
  Array<void_*> cmsgSpace_heap;
  Fault f_1;
  Fault f;
  DebugComparison<unsigned_long,_int> _kjCondition;
  iovec iov_stack [16];
  ArrayPtr<const_unsigned_char> *local_2c8;
  undefined1 local_2b8 [80];
  OwnPromiseNode local_268;
  ulong uStack_260;
  undefined8 *local_258;
  undefined8 *local_248;
  ulong local_240;
  TransformPromiseNodeBase *local_238;
  ulong local_230;
  AsyncStreamFd *local_228;
  Fault local_220;
  msghdr local_218;
  undefined1 local_1d8 [16];
  OwnPromiseNode local_1c8;
  undefined1 *local_1c0;
  bool local_1b8;
  ArrayPtr<const_int> local_158;
  ArrayPtr<const_int> local_148;
  iovec local_138 [16];
  
  pPVar11 = (PromiseArena *)firstPiece.size_;
  firstPiece_00.ptr = (PromiseArena *)firstPiece.ptr;
  pbVar14 = (byte *)morePieces.size_;
  local_2c8 = morePieces.ptr;
  pPVar1 = (PromiseNode *)((long)&in_R9->_vptr_Disposer + 1);
  elementCount = (PromiseNode *)0x400;
  if (pPVar1 < (PromiseNode *)0x400) {
    elementCount = pPVar1;
  }
  pAVar15 = local_2c8;
  local_2b8._24_8_ = pPVar11;
  if (pPVar1 < (PromiseNode *)0x11) {
    local_2b8._48_8_ = (iovec *)0x0;
    local_2b8._56_8_ = (PromiseNode *)0x0;
    local_2b8._64_8_ = (Disposer *)0x0;
    __iovec = local_138;
    local_138[0].iov_base = pPVar11;
    local_138[0].iov_len = (size_t)local_2c8;
    if ((PromiseNode *)0x1 < pPVar1) goto LAB_00490856;
  }
  else {
    __iovec = (iovec *)kj::_::HeapArrayDisposer::allocateImpl
                                 (0x10,(size_t)elementCount,(size_t)elementCount,
                                  (_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_2b8._64_8_ = &kj::_::HeapArrayDisposer::instance;
    __iovec->iov_base = pPVar11;
    __iovec->iov_len = (size_t)local_2c8;
    local_2b8._48_8_ = __iovec;
    local_2b8._56_8_ = elementCount;
LAB_00490856:
    lVar10 = 0x10;
    do {
      *(undefined8 *)((long)&__iovec->iov_base + lVar10) = *(undefined8 *)(pbVar14 + lVar10 + -0x10)
      ;
      lVar2 = *(long *)(pbVar14 + lVar10 + -8);
      *(long *)((long)&__iovec->iov_len + lVar10) = lVar2;
      pAVar15 = (ArrayPtr<const_unsigned_char> *)
                ((long)&((PromiseArenaMember *)&pAVar15->ptr)->_vptr_PromiseArenaMember + lVar2);
      lVar10 = lVar10 + 0x10;
    } while ((long)elementCount << 4 != lVar10);
  }
  local_2b8._40_8_ = pAVar15;
  if (pAVar15 == (ArrayPtr<const_unsigned_char> *)0x0) {
    local_1d8._0_8_ = fds.size_;
    local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffff00000000;
    local_1c8.ptr = (PromiseNode *)0x4d6514;
    local_1c0 = &DAT_00000005;
    local_1b8 = fds.size_ == 0;
    if (!local_1b8) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[30]>
                ((Fault *)&local_218,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x304,FAILED,"fds.size() == 0","_kjCondition,\"can\'t write FDs without bytes\"",
                 (DebugComparison<unsigned_long,_int> *)local_1d8,
                 (char (*) [30])"can\'t write FDs without bytes");
      kj::_::Debug::Fault::fatal((Fault *)&local_218);
    }
    kj::_::readyNow();
  }
  else {
    local_2b8._32_8_ = in_R9;
    if (fds.size_ == 0) {
      do {
        pAVar7 = (ArrayPtr<const_unsigned_char> *)
                 writev(*(int *)((firstPiece_00.ptr)->bytes + 0x10),__iovec,(int)elementCount);
        if (-1 < (long)pAVar7) goto LAB_00490c27;
        iVar5 = kj::_::Debug::getOsErrorNumber(true);
      } while (iVar5 == -1);
      if (iVar5 == 0) goto LAB_00490cbe;
      local_218.msg_name = elementCount;
      kj::_::Debug::Fault::Fault<int,unsigned_long&,unsigned_long>
                ((Fault *)local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x30a,iVar5,"n = ::writev(fd, iov.begin(), iov.size())","iovTotal, iov.size()",
                 (unsigned_long *)(local_2b8 + 0x28),(unsigned_long *)&local_218);
      kj::_::Debug::Fault::~Fault((Fault *)local_1d8);
    }
    else {
      local_218.msg_control = (void *)0x0;
      local_218.msg_controllen = 0;
      local_218.msg_name = (PromiseNode *)0x0;
      local_218.msg_namelen = 0;
      local_218._12_4_ = 0;
      local_218.msg_flags = 0;
      local_218._52_4_ = 0;
      local_230 = fds.size_ * 4 + 7;
      uVar17 = local_230 & 0xfffffffffffffff8;
      local_228 = this;
      local_218.msg_iov = __iovec;
      local_218.msg_iovlen = (size_t)elementCount;
      if (uVar17 + 0x17 < 0x88) {
        local_258 = (undefined8 *)0x0;
        pTVar6 = (TransformPromiseNodeBase *)local_1d8;
        local_248 = (undefined8 *)0x0;
        local_240 = 0;
        local_238 = (TransformPromiseNodeBase *)0x0;
      }
      else {
        elementCount_00 = uVar17 + 0x17 >> 3;
        pTVar6 = (TransformPromiseNodeBase *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,elementCount_00,elementCount_00,(_func_void_void_ptr *)0x0,
                            (_func_void_void_ptr *)0x0);
        local_248 = &kj::_::HeapArrayDisposer::instance;
        local_258 = &kj::_::HeapArrayDisposer::instance;
        local_240 = elementCount_00;
        local_238 = pTVar6;
      }
      local_268.ptr = &local_238->super_PromiseNode;
      uStack_260 = local_240;
      memset(pTVar6,0,uVar17 + 0x10);
      pTVar16 = pTVar6;
      if (0xffffffffffffffef < local_230) {
        pTVar16 = (TransformPromiseNodeBase *)0x0;
      }
      (pTVar16->super_PromiseNode).super_PromiseArenaMember.arena = (PromiseArena *)0x100000001;
      (pTVar16->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember =
           (_func_int **)(fds.size_ * 4 + 0x10);
      __dest = (OwnPromiseNode *)0x10;
      if (0xffffffffffffffef >= local_230) {
        __dest = &pTVar6->dependency;
      }
      local_218.msg_control = pTVar6;
      local_218.msg_controllen = uVar17 + 0x10;
      memcpy(__dest,fds.ptr,fds.size_ * 4);
      this = local_228;
      do {
        pAVar7 = (ArrayPtr<const_unsigned_char> *)
                 sendmsg(*(int *)((firstPiece_00.ptr)->bytes + 0x10),&local_218,0);
        if (-1 < (long)pAVar7) {
          iVar5 = 0;
          PVar8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)pAVar7;
          goto LAB_00490b88;
        }
        iVar5 = kj::_::Debug::getOsErrorNumber(true);
      } while (iVar5 == -1);
      PVar8.node.ptr = (OwnPromiseNode)(PromiseNode *)CONCAT44(extraout_var,iVar5);
      if (iVar5 != 0) {
        local_220.exception = (Exception *)0x0;
        local_2b8._0_8_ = (UnixEventPort *)0x0;
        local_2b8._8_4_ = 0;
        local_2b8._12_4_ = 0;
        kj::_::Debug::Fault::init
                  (&local_220,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                  );
        kj::_::Debug::Fault::~Fault(&local_220);
        iVar5 = 0xb;
        PVar8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX;
      }
LAB_00490b88:
      if (local_238 != (TransformPromiseNodeBase *)0x0) {
        local_268.ptr = (PromiseNode *)0x0;
        uStack_260 = 0;
        PVar8.node.ptr =
             (OwnPromiseNode)(**(code **)*local_248)(local_248,local_238,8,local_240,local_240,0);
      }
      if (iVar5 == 0) {
        if (-1 < (long)pAVar7) {
LAB_00490c27:
          if (pAVar7 == (ArrayPtr<const_unsigned_char> *)0x0) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                      ((Fault *)local_1d8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                       ,0x350,FAILED,(char *)0x0,"\"non-empty sendmsg() returned 0\"",
                       (char (*) [31])"non-empty sendmsg() returned 0");
            kj::_::Debug::Fault::fatal((Fault *)local_1d8);
          }
          if (local_2c8 <= pAVar7) {
            do {
              pbVar13 = pbVar14;
              bVar18 = (Disposer *)local_2b8._32_8_ == (Disposer *)0x0;
              local_2b8._32_8_ = (long)&((Disposer *)(local_2b8._32_8_ + -8))->_vptr_Disposer + 7;
              if (bVar18) {
                local_2b8._40_8_ = pAVar15;
                kj::_::readyNow();
                goto LAB_00490bd5;
              }
              pAVar7 = (ArrayPtr<const_unsigned_char> *)((long)pAVar7 - (long)local_2c8);
              pAVar15 = (ArrayPtr<const_unsigned_char> *)((long)pAVar15 - (long)local_2c8);
              local_2c8 = *(ArrayPtr<const_unsigned_char> **)(pbVar13 + 8);
              pbVar14 = pbVar13 + 0x10;
            } while (local_2c8 <= pAVar7);
            local_2b8._24_8_ = *(undefined8 *)pbVar13;
          }
          firstPiece_00.size_ =
               (byte *)local_2b8._24_8_ +
               (long)&((PromiseArenaMember *)&pAVar7->ptr)->_vptr_PromiseArenaMember;
          morePieces_00.ptr = (ArrayPtr<const_unsigned_char> *)((long)local_2c8 - (long)pAVar7);
          local_2b8._40_8_ = (long)pAVar15 - (long)pAVar7;
          pAVar12 = &local_158;
          if ((ArrayPtr<const_unsigned_char> *)local_2b8._40_8_ ==
              (ArrayPtr<const_unsigned_char> *)0x0) {
            pAVar12 = &local_148;
          }
          pAVar12->ptr = (int *)0x0;
          pAVar12->size_ = 0;
          morePieces_00.size_ = (size_t)pbVar14;
          PVar8.node.ptr = (OwnPromiseNode)writeInternal(this,firstPiece_00,morePieces_00,*pAVar12);
          goto LAB_00490be0;
        }
LAB_00490cbe:
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_2b8);
        uVar3 = local_2b8._0_8_;
        pPVar11 = (PromiseArena *)
                  ((SleepHooks *)&((PromiseArenaMember *)local_2b8._0_8_)->arena)->_vptr_SleepHooks;
        if (pPVar11 == (PromiseArena *)0x0 || (ulong)(local_2b8._0_8_ - (long)pPVar11) < 0x58) {
          pvVar9 = operator_new(0x400);
          pTVar6 = (TransformPromiseNodeBase *)((long)pvVar9 + 0x3a8);
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar6,(OwnPromiseNode *)local_2b8,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:833:50)>
                     ::anon_class_56_4_c40b6f0a_for_func::operator());
          *(undefined ***)((long)pvVar9 + 0x3a8) = &PTR_destroy_006e2040;
          *(undefined8 *)((long)pvVar9 + 0x3c8) = local_2b8._24_8_;
          *(ArrayPtr<const_unsigned_char> **)((long)pvVar9 + 0x3d0) = local_2c8;
          *(byte **)((long)pvVar9 + 0x3d8) = pbVar14;
          *(undefined8 *)((long)pvVar9 + 0x3e0) = local_2b8._32_8_;
          *(int **)((long)pvVar9 + 1000) = fds.ptr;
          *(size_t *)((long)pvVar9 + 0x3f0) = fds.size_;
          *(PromiseArena **)((long)pvVar9 + 0x3f8) = firstPiece_00.ptr;
          *(void **)((long)pvVar9 + 0x3b0) = pvVar9;
        }
        else {
          ((SleepHooks *)&((PromiseArenaMember *)local_2b8._0_8_)->arena)->_vptr_SleepHooks =
               (_func_int **)0x0;
          pTVar6 = (TransformPromiseNodeBase *)
                   &((PromiseArenaMember *)(local_2b8._0_8_ + -0x60))->arena;
          kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                    (pTVar6,(OwnPromiseNode *)local_2b8,
                     kj::_::
                     SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:833:50)>
                     ::anon_class_56_4_c40b6f0a_for_func::operator());
          ((PromiseArenaMember *)(uVar3 + -0x60))->arena = (PromiseArena *)&PTR_destroy_006e2040;
          ((PromiseArenaMember *)(uVar3 + -0x40))->arena = (PromiseArena *)local_2b8._24_8_;
          ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember =
               (_func_int **)local_2c8;
          ((PromiseArenaMember *)(uVar3 + -0x30))->arena = (PromiseArena *)pbVar14;
          ((PromiseArenaMember *)(uVar3 + -0x20))->_vptr_PromiseArenaMember =
               (_func_int **)local_2b8._32_8_;
          ((PromiseArenaMember *)(uVar3 + -0x20))->arena = (PromiseArena *)fds.ptr;
          ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember =
               (_func_int **)fds.size_;
          ((PromiseArenaMember *)(uVar3 + -0x10))->arena = firstPiece_00.ptr;
          ((PromiseArenaMember *)(uVar3 + -0x50))->_vptr_PromiseArenaMember = (_func_int **)pPVar11;
        }
        local_1d8._0_8_ = &DAT_004ddfe0;
        local_1d8._8_8_ = &DAT_004de03f;
        local_1c8.ptr = (PromiseNode *)0x4c0000058b;
        local_268.ptr = &pTVar6->super_PromiseNode;
        kj::_::PromiseDisposer::
        appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
                  ((PromiseDisposer *)&local_218,&local_268,(SourceLocation *)local_1d8);
        node.ptr = local_268.ptr;
        (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = (_func_int **)local_218.msg_name;
        PVar8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_218.msg_name;
        if ((TransformPromiseNodeBase *)local_268.ptr != (TransformPromiseNodeBase *)0x0) {
          local_268.ptr = (PromiseNode *)0x0;
          kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
          PVar8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX_00;
        }
        uVar3 = local_2b8._0_8_;
        if ((UnixEventPort *)local_2b8._0_8_ != (UnixEventPort *)0x0) {
          local_2b8._0_8_ = (UnixEventPort *)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
          PVar8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)extraout_RAX_01.ptr;
        }
        goto LAB_00490be0;
      }
      if (iVar5 != 0xb) goto LAB_00490be0;
    }
    kj::_::readyNow();
  }
LAB_00490bd5:
  (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
  _vptr_AsyncInputStream = (_func_int **)local_1d8._0_8_;
  PVar8.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_1d8._0_8_;
LAB_00490be0:
  uVar4 = local_2b8._56_8_;
  uVar3 = local_2b8._48_8_;
  if ((iovec *)local_2b8._48_8_ != (iovec *)0x0) {
    local_2b8._48_8_ = (Disposer *)0x0;
    local_2b8._56_8_ = (PromiseFulfiller<void> *)0x0;
    iVar5 = (***(_func_int ***)local_2b8._64_8_)(local_2b8._64_8_,uVar3,0x10,uVar4,uVar4,0);
    PVar8.node.ptr = (OwnPromiseNode)CONCAT44(extraout_var_00,iVar5);
  }
  return (Promise<void>)PVar8.node.ptr;
}

Assistant:

Promise<void> writeInternal(ArrayPtr<const byte> firstPiece,
                              ArrayPtr<const ArrayPtr<const byte>> morePieces,
                              ArrayPtr<const int> fds) {
    const size_t iovmax = kj::miniposix::iovMax();
    // If there are more than IOV_MAX pieces, we'll only write the first IOV_MAX for now, and
    // then we'll loop later.
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(1 + morePieces.size(), iovmax), 16, 128);
    size_t iovTotal = 0;

    // writev() interface is not const-correct.  :(
    iov[0].iov_base = const_cast<byte*>(firstPiece.begin());
    iov[0].iov_len = firstPiece.size();
    iovTotal += iov[0].iov_len;
    for (uint i = 1; i < iov.size(); i++) {
      iov[i].iov_base = const_cast<byte*>(morePieces[i - 1].begin());
      iov[i].iov_len = morePieces[i - 1].size();
      iovTotal += iov[i].iov_len;
    }

    if (iovTotal == 0) {
      KJ_REQUIRE(fds.size() == 0, "can't write FDs without bytes");
      return kj::READY_NOW;
    }

    ssize_t n;
    if (fds.size() == 0) {
      KJ_NONBLOCKING_SYSCALL(n = ::writev(fd, iov.begin(), iov.size()), iovTotal, iov.size()) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    } else {
      struct msghdr msg;
      memset(&msg, 0, sizeof(msg));
      msg.msg_iov = iov.begin();
      msg.msg_iovlen = iov.size();

      // Allocate space to send a cmsg.
      size_t msgBytes = CMSG_SPACE(sizeof(int) * fds.size());
      // On Linux, CMSG_SPACE will align to a word-size boundary, but on Mac it always aligns to a
      // 32-bit boundary. I guess aligning to 32 bits helps avoid the problem where you
      // surprisingly end up with space for two file descriptors when you only wanted one. However,
      // cmsghdr's preferred alignment is word-size (it contains a size_t). If we stack-allocate
      // the buffer, we need to make sure it is aligned properly (maybe not on x64, but maybe on
      // other platforms), so we want to allocate an array of words (we use void*). So... we use
      // CMSG_SPACE() and then additionally round up to deal with Mac.
      size_t msgWords = (msgBytes + sizeof(void*) - 1) / sizeof(void*);
      KJ_STACK_ARRAY(void*, cmsgSpace, msgWords, 16, 256);
      auto cmsgBytes = cmsgSpace.asBytes();
      memset(cmsgBytes.begin(), 0, cmsgBytes.size());
      msg.msg_control = cmsgBytes.begin();
      msg.msg_controllen = msgBytes;

      struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg);
      cmsg->cmsg_level = SOL_SOCKET;
      cmsg->cmsg_type = SCM_RIGHTS;
      cmsg->cmsg_len = CMSG_LEN(sizeof(int) * fds.size());
      memcpy(CMSG_DATA(cmsg), fds.begin(), fds.asBytes().size());

      KJ_NONBLOCKING_SYSCALL(n = ::sendmsg(fd, &msg, 0)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    }

    if (false) {
    error:
      return kj::READY_NOW;
    }

    if (n < 0) {
      // Got EAGAIN. Nothing was written.
      return observer.whenBecomesWritable().then([firstPiece, morePieces, fds, this]() {
        return writeInternal(firstPiece, morePieces, fds);
      });
    } else if (n == 0) {
      // Why would a sendmsg() with a non-empty message ever return 0 when writing to a stream
      // socket? If there's no room in the send buffer, it should fail with EAGAIN. If the
      // connection is closed, it should fail with EPIPE. Various documents and forum posts around
      // the internet claim this can happen but no one seems to know when. My guess is it can only
      // happen if we try to send an empty message -- which we didn't. So I think this is
      // impossible. If it is possible, we need to figure out how to correctly handle it, which
      // depends on what caused it.
      //
      // Note in particular that if 0 is a valid return here, and we sent an SCM_RIGHTS message,
      // we need to know whether the message was sent or not, in order to decide whether to retry
      // sending it!
      KJ_FAIL_ASSERT("non-empty sendmsg() returned 0");
    }

    // Non-zero bytes were written. This also implies that *all* FDs were written.

    // Discard all data that was written, then issue a new write for what's left (if any).
    for (;;) {
      if (n < firstPiece.size()) {
        // Only part of the first piece was consumed.  Wait for buffer space and then write again.
        firstPiece = firstPiece.slice(n, firstPiece.size());
        iovTotal -= n;

        if (iovTotal == 0) {
          // Oops, what actually happened is that we hit the IOV_MAX limit. Don't wait.
          return writeInternal(firstPiece, morePieces, nullptr);
        }

        // As with read(), we cannot assume that a short write() really means the write buffer is
        // full (see comments in the read path above). We have to write again.
        return writeInternal(firstPiece, morePieces, nullptr);
      } else if (morePieces.size() == 0) {
        // First piece was fully-consumed and there are no more pieces, so we're done.
        KJ_DASSERT(n == firstPiece.size(), n);
        return READY_NOW;
      } else {
        // First piece was fully consumed, so move on to the next piece.
        n -= firstPiece.size();
        iovTotal -= firstPiece.size();
        firstPiece = morePieces[0];
        morePieces = morePieces.slice(1, morePieces.size());
      }
    }
  }